

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O2

size_t interpolative_internal::decode(uint32_t *f,uint32_t *out_buf,size_t n,size_t u)

{
  bit_stream local_50;
  
  local_50.first_ptr = local_50.buf;
  local_50.last_ptr = local_50.buf + 1;
  local_50.write_mode = false;
  local_50.in_word_offset = '\0';
  local_50.of = f + 1;
  local_50.bytes_written = 0;
  local_50.buf[0] = *f;
  local_50.bytes_consumed = 4;
  local_50.cur_ptr = local_50.first_ptr;
  decode_interpolative(&local_50,out_buf,n,1,u + 1);
  if ((local_50.write_mode == true) && (local_50.in_word_offset != '\0')) {
    *local_50.of = *local_50.first_ptr;
  }
  return local_50.bytes_consumed >> 2;
}

Assistant:

static inline size_t decode(
        const uint32_t* f, uint32_t* out_buf, size_t n, size_t u)
    {
        bit_stream is((uint32_t*)f, false);
        size_t low = 1;
        size_t high = u + 1;
        decode_interpolative(is, out_buf, n, low, high);
        return is.u32_read();
    }